

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void codeInteger(Parse *pParse,Expr *pExpr,int negFlag,int iMem)

{
  char *z_00;
  int iVar1;
  char *pcVar2;
  char *local_48;
  char *z;
  i64 value;
  int c;
  int i;
  Vdbe *v;
  int iMem_local;
  int negFlag_local;
  Expr *pExpr_local;
  Parse *pParse_local;
  
  _c = pParse->pVdbe;
  v._0_4_ = iMem;
  v._4_4_ = negFlag;
  _iMem_local = pExpr;
  pExpr_local = (Expr *)pParse;
  if ((pExpr->flags & 0x400) == 0) {
    z_00 = (pExpr->u).zToken;
    value._0_4_ = sqlite3DecOrHexToI64(z_00,(i64 *)&z);
    if (((((int)value == 3) && (v._4_4_ == 0)) || ((int)value == 2)) ||
       ((v._4_4_ != 0 && (z == (char *)0x8000000000000000)))) {
      iVar1 = sqlite3_strnicmp(z_00,"0x",2);
      if (iVar1 == 0) {
        pcVar2 = "";
        if (v._4_4_ != 0) {
          pcVar2 = "-";
        }
        sqlite3ErrorMsg((Parse *)pExpr_local,"hex literal too big: %s%s",pcVar2,z_00);
      }
      else {
        codeReal(_c,z_00,v._4_4_,(int)v);
      }
    }
    else {
      if (v._4_4_ != 0) {
        if ((int)value == 3) {
          local_48 = (char *)0x8000000000000000;
        }
        else {
          local_48 = (char *)-(long)z;
        }
        z = local_48;
      }
      sqlite3VdbeAddOp4Dup8(_c,0x47,0,(int)v,0,(u8 *)&z,-0xe);
    }
  }
  else {
    value._4_4_ = (pExpr->u).iValue;
    if (negFlag != 0) {
      value._4_4_ = -value._4_4_;
    }
    sqlite3VdbeAddOp2(_c,0x46,value._4_4_,iMem);
  }
  return;
}

Assistant:

static void codeInteger(Parse *pParse, Expr *pExpr, int negFlag, int iMem){
  Vdbe *v = pParse->pVdbe;
  if( pExpr->flags & EP_IntValue ){
    int i = pExpr->u.iValue;
    assert( i>=0 );
    if( negFlag ) i = -i;
    sqlite3VdbeAddOp2(v, OP_Integer, i, iMem);
  }else{
    int c;
    i64 value;
    const char *z = pExpr->u.zToken;
    assert( z!=0 );
    c = sqlite3DecOrHexToI64(z, &value);
    if( (c==3 && !negFlag) || (c==2) || (negFlag && value==SMALLEST_INT64)){
#ifdef SQLITE_OMIT_FLOATING_POINT
      sqlite3ErrorMsg(pParse, "oversized integer: %s%s", negFlag ? "-" : "", z);
#else
#ifndef SQLITE_OMIT_HEX_INTEGER
      if( sqlite3_strnicmp(z,"0x",2)==0 ){
        sqlite3ErrorMsg(pParse, "hex literal too big: %s%s", negFlag?"-":"",z);
      }else
#endif
      {
        codeReal(v, z, negFlag, iMem);
      }
#endif
    }else{
      if( negFlag ){ value = c==3 ? SMALLEST_INT64 : -value; }
      sqlite3VdbeAddOp4Dup8(v, OP_Int64, 0, iMem, 0, (u8*)&value, P4_INT64);
    }
  }
}